

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O2

uint4 ActionLikelyTrash::countMarks(PcodeOp *op)

{
  uint uVar1;
  pointer ppVVar2;
  PcodeOp *pPVar3;
  uint4 uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer ppVVar8;
  
  ppVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2) >> 3;
  uVar7 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  uVar4 = 0;
  do {
    if (uVar7 == uVar6) {
      return uVar4;
    }
    ppVVar8 = ppVVar2 + uVar7;
    while( true ) {
      uVar1 = (*ppVVar8)->flags;
      if ((uVar1 & 1) != 0) break;
      if ((uVar1 & 0x10) == 0) goto LAB_0030dec6;
      pPVar3 = (*ppVVar8)->def;
      if (pPVar3 == op) break;
      if (pPVar3->opcode->opcode != CPUI_INDIRECT) goto LAB_0030dec6;
      ppVVar8 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    uVar4 = uVar4 + 1;
LAB_0030dec6:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

uint4 ActionLikelyTrash::countMarks(PcodeOp *op)

{
  uint4 res = 0;
  for(int4 i=0;i<op->numInput();++i) {
    Varnode *vn = op->getIn(i);
    for(;;) {
      if (vn->isMark()) {
	res += 1;
	break;
      }
      if (!vn->isWritten()) break;
      PcodeOp *defOp = vn->getDef();
      if (defOp == op) {	// We have looped all the way around
	res += 1;
	break;
      }
      else if (defOp->code() != CPUI_INDIRECT)	// Chain up through INDIRECTs
	break;
      vn = vn->getDef()->getIn(0);
    }
  }
  return res;
}